

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::EnumTypeSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,EnumTypeSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *local_80;
  SyntaxNode *local_70;
  size_t index_local;
  EnumTypeSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->keyword).kind;
    token._2_1_ = (this->keyword).field_0x2;
    token.numFlags.raw = (this->keyword).numFlags.raw;
    token.rawLen = (this->keyword).rawLen;
    token.info = (this->keyword).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(SyntaxNode *)this->baseType);
    break;
  case 2:
    token_00.kind = (this->openBrace).kind;
    token_00._2_1_ = (this->openBrace).field_0x2;
    token_00.numFlags.raw = (this->openBrace).numFlags.raw;
    token_00.rawLen = (this->openBrace).rawLen;
    token_00.info = (this->openBrace).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    local_70 = (SyntaxNode *)0x0;
    if (this != (EnumTypeSyntax *)0xffffffffffffffc8) {
      local_70 = &(this->members).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 4:
    token_01.kind = (this->closeBrace).kind;
    token_01._2_1_ = (this->closeBrace).field_0x2;
    token_01.numFlags.raw = (this->closeBrace).numFlags.raw;
    token_01.rawLen = (this->closeBrace).rawLen;
    token_01.info = (this->closeBrace).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 5:
    local_80 = (SyntaxNode *)0x0;
    if (this != (EnumTypeSyntax *)0xffffffffffffff88) {
      local_80 = &(this->dimensions).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_80);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax EnumTypeSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return keyword;
        case 1: return baseType;
        case 2: return openBrace;
        case 3: return &members;
        case 4: return closeBrace;
        case 5: return &dimensions;
        default: return nullptr;
    }
}